

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

int __thiscall PFloat::GetLoadOp(PFloat *this)

{
  PFloat *this_local;
  
  if (*(int *)&(this->super_PBasicType).super_PType.super_DObject.field_0x24 == 4) {
    this_local._4_4_ = 0x11;
  }
  else {
    if (*(int *)&(this->super_PBasicType).super_PType.super_DObject.field_0x24 != 8) {
      __assert_fail("Size == 8",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobjtype.cpp"
                    ,0x59b,"virtual int PFloat::GetLoadOp() const");
    }
    this_local._4_4_ = 0x13;
  }
  return this_local._4_4_;
}

Assistant:

int PFloat::GetLoadOp() const
{
	if (Size == 4)
	{
		return OP_LSP;
	}
	else
	{
		assert(Size == 8);
		return OP_LDP;
	}
	assert(0 && "Cannot load this type");
	return OP_NOP;
}